

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::verifyWidePointAt
          (PointRenderCase *this,IVec2 *pointPos,Surface *viewport,GeneratedPoint *refPoint,
          IVec4 *bbox,ResultPointType pointType,int componentNdx,int *logFloodCounter)

{
  int expectedPointSize;
  bool bVar1;
  pointer pVVar2;
  int iVar3;
  bool bVar4;
  int ndx;
  float fVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int ndx_1;
  long lVar9;
  int iVar10;
  IVec2 *pIVar11;
  long lVar12;
  Vector<float,_2> local_238;
  IVec2 *local_230;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsUpwards;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widths;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> widthsDownwards;
  IVec2 unionRange;
  ostringstream local_1a8 [376];
  
  expectedPointSize = refPoint->size;
  widthsUpwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  widthsDownwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  widthsUpwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  widthsUpwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  widthsDownwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  widthsDownwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar5 = (float)pointPos->m_data[1];
  iVar10 = -(int)fVar5;
  local_230 = pointPos;
  for (; (-1 < (int)fVar5 && (bbox->m_data[1] <= (int)fVar5)); fVar5 = (float)((int)fVar5 + -1)) {
    if (expectedPointSize < local_230->m_data[1] + iVar10) goto LAB_01394c8b;
    local_238.m_data[0] =
         *(float *)((long)(viewport->m_pixels).m_ptr +
                   (long)(viewport->m_width * (int)fVar5 + local_230->m_data[0]) * 4);
    tcu::RGBA::toIVec((RGBA *)&unionRange);
    if (unionRange.m_data[componentNdx] == 0) goto LAB_01394c8b;
    local_238.m_data[1] = fVar5;
    local_238.m_data[0] = (float)local_230->m_data[0];
    scanPointWidthAt((PointRenderCase *)&unionRange,(IVec2 *)&local_238,viewport,expectedPointSize,
                     componentNdx);
    std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
    emplace_back<tcu::Vector<int,2>>
              ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&widthsUpwards,
               (Vector<int,_2> *)&unionRange);
    iVar10 = iVar10 + 1;
  }
  if ((((int)fVar5 < 0) || (pointType == POINT_PARTIAL && (int)fVar5 < bbox->m_data[1])) &&
     (widthsUpwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      widthsUpwards.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    if (pointType == POINT_PARTIAL) {
      bVar4 = true;
      if (widthsUpwards.
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].m_data[0] <= bbox->m_data[0]) goto LAB_0139500d;
      bVar1 = bbox->m_data[2] <=
              widthsUpwards.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_finish[-1].m_data[1];
    }
    else {
      bVar1 = false;
    }
    bVar4 = true;
    if ((expectedPointSize <=
         (widthsUpwards.
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].m_data[1] -
         widthsUpwards.
         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].m_data[0]) + 1) || (bVar1)) goto LAB_0139500d;
  }
LAB_01394c8b:
  fVar5 = (float)local_230->m_data[1];
  pIVar11 = local_230;
  while( true ) {
    fVar5 = (float)((int)fVar5 + 1);
    if ((bbox->m_data[3] <= (int)fVar5) || (viewport->m_height <= (int)fVar5)) break;
    if (expectedPointSize < (int)fVar5 - pIVar11->m_data[1]) goto LAB_01394dce;
    local_238.m_data[0] =
         *(float *)((long)(viewport->m_pixels).m_ptr +
                   (long)(viewport->m_width * (int)fVar5 + pIVar11->m_data[0]) * 4);
    tcu::RGBA::toIVec((RGBA *)&unionRange);
    pIVar11 = local_230;
    if (unionRange.m_data[componentNdx] == 0) goto LAB_01394dce;
    local_238.m_data[1] = fVar5;
    local_238.m_data[0] = (float)local_230->m_data[0];
    scanPointWidthAt((PointRenderCase *)&unionRange,(IVec2 *)&local_238,viewport,expectedPointSize,
                     componentNdx);
    std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
    emplace_back<tcu::Vector<int,2>>
              ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&widthsDownwards,
               (Vector<int,_2> *)&unionRange);
  }
  if (pointType == POINT_PARTIAL && bbox->m_data[3] <= (int)fVar5 ||
      viewport->m_height <= (int)fVar5) {
    if (widthsDownwards.
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_start ==
        widthsDownwards.
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pVVar2 = widthsUpwards.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (widthsUpwards.
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          widthsUpwards.
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_01394dce;
    }
    else {
      pVVar2 = widthsDownwards.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + -1;
    }
    iVar10 = pVVar2->m_data[0];
    iVar6 = pVVar2->m_data[1];
    if (pointType == POINT_PARTIAL) {
      bVar1 = true;
      if (bbox->m_data[0] < iVar10) {
        bVar1 = bbox->m_data[2] + -1 <= iVar6;
      }
    }
    else {
      bVar1 = false;
    }
    bVar4 = true;
    if (((iVar10 < 1) || ((bool)(expectedPointSize <= (iVar6 - iVar10) + 1 | bVar1))) ||
       (viewport->m_width + -1 <= iVar6)) goto LAB_0139500d;
  }
LAB_01394dce:
  iVar6 = 0;
  iVar10 = -1;
  while( true ) {
    iVar3 = (int)((ulong)((long)widthsUpwards.
                                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)widthsUpwards.
                               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar3 <= iVar6) break;
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (&widths,widthsUpwards.
                       super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (iVar3 + iVar10));
    iVar6 = iVar6 + 1;
    iVar10 = iVar10 + -1;
  }
  lVar12 = 0;
  for (lVar9 = 0; pIVar11 = local_230,
      lVar9 < (int)((ulong)((long)widthsDownwards.
                                  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)widthsDownwards.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); lVar9 = lVar9 + 1
      ) {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (&widths,(value_type *)
                       ((long)(widthsDownwards.
                               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12));
    lVar12 = lVar12 + 8;
  }
  lVar9 = 0x100000000;
  for (lVar12 = 0;
      lVar12 < ((int)((ulong)((long)widths.
                                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)widths.
                                   super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) -
               expectedPointSize) + 1; lVar12 = lVar12 + 1) {
    tcu::Vector<int,_2>::Vector
              (&unionRange,
               widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar12);
    lVar7 = lVar9;
    iVar10 = unionRange.m_data[0];
    iVar6 = unionRange.m_data[1];
    for (lVar8 = 1; lVar8 < expectedPointSize; lVar8 = lVar8 + 1) {
      iVar3 = *(int *)((long)(widths.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + (lVar7 >> 0x1d));
      if (iVar10 <= iVar3) {
        iVar10 = iVar3;
      }
      iVar3 = *(int *)((long)(widths.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      (lVar7 >> 0x1d) + 4);
      if (iVar3 <= iVar6) {
        iVar6 = iVar3;
      }
      unionRange.m_data[1] = iVar6;
      unionRange.m_data[0] = iVar10;
      lVar7 = lVar7 + 0x100000000;
    }
    if (pointType == POINT_PARTIAL) {
      bVar1 = true;
      if (bbox->m_data[0] < iVar10) {
        bVar1 = bbox->m_data[2] + -1 <= iVar6;
      }
    }
    else {
      bVar1 = false;
    }
    if (((iVar10 < 1) || ((bool)(expectedPointSize <= (iVar6 - iVar10) + 1 | bVar1))) ||
       (viewport->m_width + -1 <= iVar6)) {
      bVar4 = true;
      goto LAB_0139500d;
    }
    lVar9 = lVar9 + 0x100000000;
  }
  *logFloodCounter = *logFloodCounter + -1;
  if (-1 < *logFloodCounter) {
    unionRange.m_data =
         (int  [2])
         ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Missing ");
    std::ostream::operator<<(local_1a8,expectedPointSize);
    std::operator<<((ostream *)local_1a8,"x");
    std::ostream::operator<<(local_1a8,expectedPointSize);
    std::operator<<((ostream *)local_1a8," point near ");
    tcu::operator<<((ostream *)local_1a8,pIVar11);
    std::operator<<((ostream *)local_1a8,", vertex coordinates=");
    local_238.m_data = *&(refPoint->center).m_data;
    tcu::operator<<((ostream *)local_1a8,&local_238);
    std::operator<<((ostream *)local_1a8,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&unionRange,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  bVar4 = false;
LAB_0139500d:
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            (&widths.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)
  ;
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            (&widthsDownwards.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            (&widthsUpwards.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>);
  return bVar4;
}

Assistant:

bool PointRenderCase::verifyWidePointAt (const tcu::IVec2& pointPos, const tcu::Surface& viewport, const GeneratedPoint& refPoint, const tcu::IVec4& bbox, ResultPointType pointType, int componentNdx, int& logFloodCounter)
{
	const int				expectedPointSize		= refPoint.size;
	bool					viewportClippedTop		= false;
	bool					viewportClippedBottom	= false;
	bool					primitiveClippedTop		= false;
	bool					primitiveClippedBottom	= false;
	std::vector<tcu::IVec2>	widthsUpwards;
	std::vector<tcu::IVec2>	widthsDownwards;
	std::vector<tcu::IVec2>	widths;

	// search upwards
	for (int y = pointPos.y();; --y)
	{
		if (y < bbox.y() || y < 0)
		{
			if (y < bbox.y())
				primitiveClippedTop = true;
			if (y < 0)
				viewportClippedTop = true;
			break;
		}
		else if (pointPos.y() - y > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsUpwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// top is clipped
	if ((viewportClippedTop || (pointType == POINT_PARTIAL && primitiveClippedTop)) && !widthsUpwards.empty())
	{
		const tcu::IVec2&	range			= widthsUpwards.back();
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			widthClipped	= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z());

		if (squareFits || widthClipped)
			return true;
	}

	// and downwards
	for (int y = pointPos.y()+1;; ++y)
	{
		if (y >= bbox.w() || y >= viewport.getHeight())
		{
			if (y >= bbox.w())
				primitiveClippedBottom = true;
			if (y >= viewport.getHeight())
				viewportClippedBottom = true;
			break;
		}
		else if (y - pointPos.y() > expectedPointSize)
		{
			// no need to go further than point height
			break;
		}
		else if (viewport.getPixel(pointPos.x(), y).toIVec()[componentNdx] == 0)
		{
			break;
		}
		else
		{
			widthsDownwards.push_back(scanPointWidthAt(tcu::IVec2(pointPos.x(), y), viewport, expectedPointSize, componentNdx));
		}
	}

	// bottom is clipped
	if ((viewportClippedBottom || (pointType == POINT_PARTIAL && primitiveClippedBottom)) && !(widthsDownwards.empty() && widthsUpwards.empty()))
	{
		const tcu::IVec2&	range			= (widthsDownwards.empty()) ? (widthsUpwards.front()) : (widthsDownwards.back());
		const bool			squareFits		= (range.y() - range.x() + 1) >= expectedPointSize;
		const bool			bboxClipped		= (pointType == POINT_PARTIAL) && (range.x() <= bbox.x() || range.y() >= bbox.z()-1);
		const bool			viewportClipped	= range.x() <= 0 || range.y() >= viewport.getWidth()-1;

		if (squareFits || bboxClipped || viewportClipped)
			return true;
	}

	// would square point would fit into the rasterized area

	for (int ndx = 0; ndx < (int)widthsUpwards.size(); ++ndx)
		widths.push_back(widthsUpwards[(int)widthsUpwards.size() - ndx - 1]);
	for (int ndx = 0; ndx < (int)widthsDownwards.size(); ++ndx)
		widths.push_back(widthsDownwards[ndx]);
	DE_ASSERT(!widths.empty());

	for (int y = 0; y < (int)widths.size() - expectedPointSize + 1; ++y)
	{
		tcu::IVec2 unionRange = widths[y];

		for (int dy = 1; dy < expectedPointSize; ++dy)
		{
			unionRange.x() = de::max(unionRange.x(), widths[y+dy].x());
			unionRange.y() = de::min(unionRange.y(), widths[y+dy].y());
		}

		// would a N x N block fit here?
		{
			const bool squareFits		= (unionRange.y() - unionRange.x() + 1) >= expectedPointSize;
			const bool bboxClipped		= (pointType == POINT_PARTIAL) && (unionRange.x() <= bbox.x() || unionRange.y() >= bbox.z()-1);
			const bool viewportClipped	= unionRange.x() <= 0 || unionRange.y() >= viewport.getWidth()-1;

			if (squareFits || bboxClipped || viewportClipped)
				return true;
		}
	}

	if (--logFloodCounter >= 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Missing " << expectedPointSize << "x" << expectedPointSize << " point near " << pointPos << ", vertex coordinates=" << refPoint.center.swizzle(0, 1) << "."
			<< tcu::TestLog::EndMessage;
	}
	return false;
}